

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

void Fra_ImpCompactArray(Vec_Int_t *vImps)

{
  int iVar1;
  undefined4 local_18;
  int Imp;
  int k;
  int i;
  Vec_Int_t *vImps_local;
  
  local_18 = 0;
  for (Imp = 0; iVar1 = Vec_IntSize(vImps), Imp < iVar1; Imp = Imp + 1) {
    iVar1 = Vec_IntEntry(vImps,Imp);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(vImps,local_18,iVar1);
      local_18 = local_18 + 1;
    }
  }
  Vec_IntShrink(vImps,local_18);
  return;
}

Assistant:

void Fra_ImpCompactArray( Vec_Int_t * vImps )
{
    int i, k, Imp;
    k = 0;
    Vec_IntForEachEntry( vImps, Imp, i )
        if ( Imp )
            Vec_IntWriteEntry( vImps, k++, Imp );
    Vec_IntShrink( vImps, k );
}